

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxAbs::Resolve(FxAbs *this,FCompileContext *ctx)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  FxConstant *this_00;
  undefined4 uVar4;
  FxExpression *v;
  ExpVal value;
  ExpVal local_20;
  FxExpression *pFVar3;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->val == (FxExpression *)0x0) {
LAB_00510639:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  iVar2 = (*this->val->_vptr_FxExpression[2])();
  pFVar3 = (FxExpression *)CONCAT44(extraout_var,iVar2);
  this->val = pFVar3;
  if (pFVar3 == (FxExpression *)0x0) goto LAB_00510639;
  if (pFVar3->ValueType == (PType *)TypeBool) {
    this->val = (FxExpression *)0x0;
LAB_00510666:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return pFVar3;
  }
  cVar1 = (**(code **)(*(long *)&pFVar3->ValueType->super_PTypeBase + 0x40))();
  if (cVar1 == '\0') {
    pFVar3 = (FxExpression *)0x0;
    FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
    goto LAB_00510666;
  }
  iVar2 = (*this->val->_vptr_FxExpression[3])();
  if ((char)iVar2 == '\0') {
    (this->super_FxExpression).ValueType = this->val->ValueType;
    return &this->super_FxExpression;
  }
  pFVar3 = this->val + 1;
  ExpVal::ExpVal(&value,(ExpVal *)pFVar3);
  if ((value.Type)->RegType == '\x01') {
    value.field_1.Float = value.field_1.Float & 0x7fffffffffffffff;
  }
  else {
    if ((value.Type)->RegType != '\0') {
      this_00 = (FxConstant *)0x0;
      goto LAB_005106d7;
    }
    uVar4 = -value.field_1.Int;
    if (0 < value.field_1.Int) {
      uVar4 = value.field_1.Int;
    }
    value.field_1.Int = uVar4;
  }
  this_00 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar3);
  ExpVal::ExpVal(&local_20,&value);
  FxConstant::FxConstant(this_00,&local_20,&(this->super_FxExpression).ScriptPosition);
  ExpVal::~ExpVal(&local_20);
LAB_005106d7:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  ExpVal::~ExpVal(&value);
  return &this_00->super_FxExpression;
}

Assistant:

FxExpression *FxAbs::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(val, ctx);

	if (val->ValueType == TypeBool)	// abs of a boolean is always the same as the operand
	{
		auto v = val;
		val = nullptr;
		delete this;
		return v;
	}
	if (!val->IsNumeric())
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return nullptr;
	}
	else if (val->isConstant())
	{
		ExpVal value = static_cast<FxConstant *>(val)->GetValue();
		switch (value.Type->GetRegType())
		{
		case REGT_INT:
			value.Int = abs(value.Int);
			break;

		case REGT_FLOAT:
			value.Float = fabs(value.Float);
			break;

		default:
			// shouldn't happen
			delete this;
			return nullptr;
		}
		FxExpression *x = new FxConstant(value, ScriptPosition);
		delete this;
		return x;
	}
	ValueType = val->ValueType;
	return this;
}